

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O0

bool from_issue_266::test_uintwide_t_spot_values_from_issue_266_inc(void)

{
  bool bVar1;
  uintwide_t<128U,_unsigned_int,_void,_false> *puVar2;
  bool local_4d;
  uintwide_t<128U,_unsigned_int,_void,_false> local_4c;
  undefined1 auStack_38 [7];
  bool result_is_ok;
  undefined1 local_28 [8];
  local_uint128_t inc_value_p;
  local_uint128_t inc_value;
  
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)
             (inc_value_p.values.super_array<unsigned_int,_4UL>.elems + 2),
             "0x0000000000000001FFFFFFFFFFFFFFFF");
  auStack_38._0_4_ = inc_value_p.values.super_array<unsigned_int,_4UL>.elems[2];
  stack0xffffffffffffffcc = inc_value_p.values.super_array<unsigned_int,_4UL>.elems[3];
  puVar2 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator++
                     ((uintwide_t<128U,_unsigned_int,_void,_false> *)auStack_38);
  local_28 = *(undefined1 (*) [8])(puVar2->values).super_array<unsigned_int,_4UL>.elems;
  inc_value_p.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
       *(undefined8 *)((puVar2->values).super_array<unsigned_int,_4UL>.elems + 2);
  bVar1 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator>
                    ((uintwide_t<128U,_unsigned_int,_void,_false> *)local_28,
                     (uintwide_t<128U,_unsigned_int,_void,_false> *)
                     (inc_value_p.values.super_array<unsigned_int,_4UL>.elems + 2));
  local_4d = false;
  if (bVar1) {
    math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t
              (&local_4c,"0x00000000000000020000000000000000");
    local_4d = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator==
                         ((uintwide_t<128U,_unsigned_int,_void,_false> *)local_28,&local_4c);
  }
  return local_4d;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_266_inc() -> bool
  {
    // See also: https://github.com/ckormanyos/wide-integer/issues/266

    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint128_t;
    #else
    using local_uint128_t = ::math::wide_integer::uint128_t;
    #endif

    local_uint128_t inc_value  ("0x0000000000000001FFFFFFFFFFFFFFFF");
    local_uint128_t inc_value_p(++(local_uint128_t(inc_value)));

    const auto result_is_ok = ((inc_value_p > inc_value) && (inc_value_p == local_uint128_t("0x00000000000000020000000000000000")));

    return result_is_ok;
  }